

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::anon_unknown_77::AsyncPipe::abortRead(AsyncPipe *this)

{
  AsyncIoStream *pAVar1;
  Disposer *pDVar2;
  PromiseFulfiller<void> *pPVar3;
  AsyncIoStream *pAVar4;
  undefined1 local_9;
  
  pAVar1 = (this->state).ptr;
  if (pAVar1 != (AsyncIoStream *)0x0) {
    (*(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[5])();
    return;
  }
  pAVar4 = (AsyncIoStream *)operator_new(0x10);
  (pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream = (_func_int **)&PTR_read_0044aa50;
  (pAVar4->super_AsyncOutputStream)._vptr_AsyncOutputStream = (_func_int **)&PTR_write_0044aad0;
  pDVar2 = (this->ownState).disposer;
  pAVar1 = (this->ownState).ptr;
  (this->ownState).disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::AsyncPipe::AbortedRead>::instance;
  (this->ownState).ptr = pAVar4;
  if (pAVar1 != (AsyncIoStream *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                      (long)&(pAVar1->super_AsyncInputStream)._vptr_AsyncInputStream);
    pAVar4 = (this->ownState).ptr;
  }
  (this->state).ptr = pAVar4;
  this->readAborted = true;
  pPVar3 = (this->readAbortFulfiller).ptr.ptr;
  if (pPVar3 != (PromiseFulfiller<void> *)0x0) {
    (**pPVar3->_vptr_PromiseFulfiller)(pPVar3,&local_9);
    pDVar2 = (this->readAbortFulfiller).ptr.disposer;
    pPVar3 = (this->readAbortFulfiller).ptr.ptr;
    (this->readAbortFulfiller).ptr.disposer = (Disposer *)0x0;
    (this->readAbortFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    if (pPVar3 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,pPVar3->_vptr_PromiseFulfiller[-2] + (long)&pPVar3->_vptr_PromiseFulfiller);
    }
  }
  return;
}

Assistant:

void abortRead() override {
    KJ_IF_MAYBE(s, state) {
      s->abortRead();
    } else {
      ownState = kj::heap<AbortedRead>();
      state = *ownState;

      readAborted = true;
      KJ_IF_MAYBE(f, readAbortFulfiller) {
        f->get()->fulfill();
        readAbortFulfiller = nullptr;
      }
    }